

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDFromMemory
               (uint8_t *addr,size_t length,string *base_dir,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *base_dir_local;
  size_t length_local;
  uint8_t *addr_local;
  
  bVar1 = IsUSDC(addr,length);
  if (bVar1) {
    addr_local._7_1_ = LoadUSDCFromMemory(addr,length,base_dir,stage,warn,err,options);
  }
  else {
    bVar1 = IsUSDA(addr,length);
    if (bVar1) {
      addr_local._7_1_ = LoadUSDAFromMemory(addr,length,base_dir,stage,warn,err,options);
    }
    else {
      bVar1 = IsUSDZ(addr,length);
      if (bVar1) {
        addr_local._7_1_ = LoadUSDZFromMemory(addr,length,base_dir,stage,warn,err,options);
      }
      else {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=
                    ((string *)err,"Couldn\'t determine USD format(USDA/USDC/USDZ).\n");
        }
        addr_local._7_1_ = false;
      }
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool LoadUSDFromMemory(const uint8_t *addr, const size_t length,
                       const std::string &base_dir, Stage *stage,
                       std::string *warn, std::string *err,
                       const USDLoadOptions &options) {
  if (IsUSDC(addr, length)) {
    DCOUT("Detected as USDC.");
    return LoadUSDCFromMemory(addr, length, base_dir, stage, warn, err,
                              options);
  } else if (IsUSDA(addr, length)) {
    DCOUT("Detected as USDA.");
    return LoadUSDAFromMemory(addr, length, base_dir, stage, warn, err,
                              options);
  } else if (IsUSDZ(addr, length)) {
    DCOUT("Detected as USDZ.");
    return LoadUSDZFromMemory(addr, length, base_dir, stage, warn, err,
                              options);
  } else {
    if (err) {
      (*err) += "Couldn't determine USD format(USDA/USDC/USDZ).\n";
    }
    return false;
  }
}